

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kg.c
# Opt level: O0

err_t kgExtr(int argc,char **argv)

{
  bool_t bVar1;
  int iVar2;
  blob_t buf;
  bign_params *params_00;
  undefined8 *in_RSI;
  int in_EDI;
  octet *pubkey;
  octet *privkey;
  size_t len;
  void *stack;
  bign_params params [1];
  cmd_pwd_t pwd;
  err_t code;
  char *in_stack_fffffffffffffe58;
  u32 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  char **in_stack_fffffffffffffe68;
  int count;
  undefined8 in_stack_fffffffffffffe70;
  char *name;
  char *in_stack_fffffffffffffe80;
  cmd_pwd_t *in_stack_fffffffffffffe88;
  bign_params *in_stack_fffffffffffffe90;
  octet *in_stack_fffffffffffffe98;
  bign_params *in_stack_fffffffffffffea0;
  octet *in_stack_fffffffffffffea8;
  cmd_pwd_t in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  size_t *in_stack_fffffffffffffee0;
  octet *in_stack_fffffffffffffee8;
  err_t local_14;
  undefined8 *local_10;
  int local_8;
  err_t local_4;
  
  name = (char *)0x0;
  local_14 = cmdStDo(in_stack_fffffffffffffe60);
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_4 = local_14;
  if (local_14 == 0) {
    while( true ) {
      in_stack_fffffffffffffe64 = in_stack_fffffffffffffe64 & 0xffffff;
      if (local_8 != 0) {
        bVar1 = strStartsWith((char *)*local_10,"-");
        in_stack_fffffffffffffe64 = CONCAT13(bVar1 != 0,(int3)in_stack_fffffffffffffe64);
      }
      count = (int)in_stack_fffffffffffffe70;
      if ((char)(in_stack_fffffffffffffe64 >> 0x18) == '\0') goto LAB_00113aaf;
      iVar2 = strCmp((char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58);
      count = (int)in_stack_fffffffffffffe70;
      if (iVar2 != 0) break;
      if (local_8 == 1) {
        local_14 = 0x25b;
        goto LAB_00113aaf;
      }
      local_14 = cmdPwdRead(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      count = (int)in_stack_fffffffffffffe70;
      if (local_14 != 0) goto LAB_00113aaf;
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
    }
    local_14 = 0x25b;
LAB_00113aaf:
    if (local_14 == 0) {
      local_14 = 0x25b;
    }
    if (local_14 == 0) {
      local_4 = cmdFileValExist(count,in_stack_fffffffffffffe68);
      if (local_4 == 0) {
        local_4 = cmdFileValNotExist(count,in_stack_fffffffffffffe68);
        if (local_4 == 0) {
          local_4 = cmdPrivkeyRead(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                   in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          if (local_4 == 0) {
            buf = blobCreate((size_t)in_stack_fffffffffffffe58);
            local_4 = 0x6e;
            if (buf != (blob_t)0x0) {
              local_4 = 0;
            }
            if (local_4 == 0) {
              params_00 = (bign_params *)((long)buf + (long)name);
              local_4 = cmdPrivkeyRead(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                       in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
              cmdPwdClose((cmd_pwd_t)0x113c8a);
              if (local_4 == 0) {
                local_4 = kgParamsStd(params_00,
                                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
                ;
                if (local_4 == 0) {
                  if (name == (char *)0x18) {
                    local_4 = bign96PubkeyCalc(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                               (octet *)in_stack_fffffffffffffe88);
                  }
                  else {
                    local_4 = bignPubkeyCalc(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                             in_stack_fffffffffffffe98);
                  }
                  if (local_4 == 0) {
                    local_4 = cmdFileWrite(name,buf,(size_t)params_00);
                    blobClose((blob_t)0x113d86);
                  }
                  else {
                    blobClose((blob_t)0x113d47);
                  }
                }
                else {
                  blobClose((blob_t)0x113cdb);
                }
              }
              else {
                blobClose((blob_t)0x113c9e);
              }
            }
            else {
              cmdPwdClose((cmd_pwd_t)0x113c28);
            }
          }
          else {
            cmdPwdClose((cmd_pwd_t)0x113bcc);
          }
        }
        else {
          cmdPwdClose((cmd_pwd_t)0x113b7a);
        }
      }
      else {
        cmdPwdClose((cmd_pwd_t)0x113b33);
      }
    }
    else {
      cmdPwdClose((cmd_pwd_t)0x113af0);
      local_4 = local_14;
    }
  }
  return local_4;
}

Assistant:

static err_t kgExtr(int argc, char* argv[])
{
	err_t code = ERR_OK;
	cmd_pwd_t pwd = 0;
	bign_params params[1];
	void* stack;
	size_t len = 0;
	octet* privkey;
	octet* pubkey;
	// самотестирование
	code = cmdStDo(CMD_ST_BELS | CMD_ST_BELT | CMD_ST_BIGN);
	ERR_CALL_CHECK(code);
	// разбор опций
	while (argc && strStartsWith(*argv, "-"))
	{
		if (strEq(*argv, "-pass"))
		{
			if (pwd)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			++argv, --argc;
			if (!argc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			code = cmdPwdRead(&pwd, *argv);
			if (code != ERR_OK)
				break;
			ASSERT(cmdPwdIsValid(pwd));
			++argv, --argc;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	if (code == ERR_OK && (!pwd || argc != 2))
		code = ERR_CMD_PARAMS;
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// проверить файл-контейнер
	code = cmdFileValExist(1, argv);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// проверить выходной файл
	code = cmdFileValNotExist(1, argv + 1);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// определить длину личного ключа
	code = cmdPrivkeyRead(0, &len, argv[0], pwd);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, len + 2 * len);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	privkey = (octet*)stack;
	pubkey = privkey + len;
	// определить личный ключ
	code = cmdPrivkeyRead(privkey, &len, argv[0], pwd);
	cmdPwdClose(pwd);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить открытый ключ
	code = kgParamsStd(params, len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	code = len == 24 ? bign96PubkeyCalc(pubkey, params, privkey) : 
		bignPubkeyCalc(pubkey, params, privkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// записать открытый ключ
	code = cmdFileWrite(argv[1], pubkey, len * 2);
	// завершить
	cmdBlobClose(stack);
	return code;
}